

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionGraph.cpp
# Opt level: O0

void PrintEnterBlock(ExpressionGraphContext *ctx,InplaceStr name,TypeBase *type)

{
  bool bVar1;
  TypeBase *type_local;
  ExpressionGraphContext *ctx_local;
  InplaceStr name_local;
  
  name_local.begin = name.end;
  ctx_local = (ExpressionGraphContext *)name.begin;
  PrintIndent(ctx);
  bVar1 = InplaceStr::empty((InplaceStr *)&ctx_local);
  if (!bVar1) {
    OutputContext::Print(ctx->output,(char *)ctx_local,(int)name_local.begin - (int)ctx_local);
    OutputContext::Print(ctx->output,": ");
  }
  if (type != (TypeBase *)0x0) {
    bVar1 = InplaceStr::empty(&type->name);
    if (!bVar1) {
      OutputContext::Print
                (ctx->output,(type->name).begin,(int)(type->name).end - (int)(type->name).begin);
      OutputContext::Print(ctx->output," ");
    }
  }
  OutputContext::Print(ctx->output,"{\n");
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ExpressionGraphContext &ctx, InplaceStr name, TypeBase *type)
{
	PrintIndent(ctx);

	if(!name.empty())
	{
		ctx.output.Print(name.begin, unsigned(name.end - name.begin));
		ctx.output.Print(": ");
	}

	if(type && !type->name.empty())
	{
		ctx.output.Print(type->name.begin, unsigned(type->name.end - type->name.begin));
		ctx.output.Print(" ");
	}

	ctx.output.Print("{\n");

	ctx.depth++;
}